

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O2

void __thiscall
amrex::DeriveRec::DeriveRec
          (DeriveRec *this,string *a_name,IndexType result_type,int nvar_derive,DeriveBoxMap box_map
          )

{
  std::__cxx11::string::string((string *)this,(string *)a_name);
  (this->variable_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->variable_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variable_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->der_type).itype = result_type.itype;
  this->n_derive = nvar_derive;
  this->func = (DeriveFunc)0x0;
  this->func_3d = (DeriveFunc3D)0x0;
  *(undefined8 *)&(this->func_fab).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->func_fab).super__Function_base._M_functor + 8) = 0;
  this->mapper = (Interpolater *)0x0;
  (this->func_fab).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->func_fab)._M_invoker = (_Invoker_type)0x0;
  this->bx_map = box_map;
  this->n_state = 0;
  this->nsr = 0;
  this->rng = (StateRange *)0x0;
  this->bcr = (int *)0x0;
  this->bcr3D = (int *)0x0;
  return;
}

Assistant:

DeriveRec::DeriveRec (const std::string&      a_name,
                      IndexType               result_type,
                      int                     nvar_derive,
                      DeriveRec::DeriveBoxMap box_map)
    :
    derive_name(a_name),
    variable_names(),
    der_type(result_type),
    n_derive(nvar_derive),
    bx_map(box_map)
{}